

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O2

void bcache_remove_clean_blocks(filemgr *file)

{
  __pointer_type pfVar1;
  list_elem *plVar2;
  size_t i;
  ulong uVar3;
  list_elem *e;
  
  pfVar1 = (file->bcache)._M_b._M_p;
  if (pfVar1 != (__pointer_type)0x0) {
    for (uVar3 = 0; uVar3 < pfVar1->num_shards; uVar3 = uVar3 + 1) {
      pthread_spin_lock(&pfVar1->shards[uVar3].lock);
      e = pfVar1->shards[uVar3].cleanlist.head;
      while (e != (list_elem *)0x0) {
        plVar2 = list_remove(&pfVar1->shards[uVar3].cleanlist,e);
        hash_remove(&pfVar1->shards[uVar3].hashtable,(hash_elem *)&e[-2].next);
        _bcache_release_freeblock((bcache_item *)&e[-3].next);
        e = plVar2;
      }
      pthread_spin_unlock(&pfVar1->shards[uVar3].lock);
    }
  }
  return;
}

Assistant:

void bcache_remove_clean_blocks(struct filemgr *file)
{
    struct list_elem *e;
    struct bcache_item *item;
    struct fnamedic_item *fname_item;

    fname_item = file->bcache;

    if (fname_item) {
        // Note that this function is only invoked as part of database file close or
        // removal when there are no database handles for a given file. Therefore,
        // we don't need to grab all the shard locks at once.

        // remove all clean blocks from each shard in a file.
        size_t i = 0;
        for (; i < fname_item->num_shards; ++i) {
            spin_lock(&fname_item->shards[i].lock);
            e = list_begin(&fname_item->shards[i].cleanlist);
            while(e){
                item = _get_entry(e, struct bcache_item, list_elem);
                // remove from clean list
                e = list_remove(&fname_item->shards[i].cleanlist, e);
                // remove from hash table
                hash_remove(&fname_item->shards[i].hashtable, &item->hash_elem);
                // insert into free list
                _bcache_release_freeblock(item);
            }
            spin_unlock(&fname_item->shards[i].lock);
        }
    }
}